

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrq.cc
# Opt level: O3

base_learner * lrq_setup(options_i *options,vw *all)

{
  _Rb_tree_header *p_Var1;
  undefined4 uVar2;
  char *pcVar3;
  char cVar4;
  options_i *poVar5;
  int iVar6;
  uint uVar7;
  LRQstate *__s;
  option_group_definition *this;
  ostream *poVar8;
  _Base_ptr p_Var9;
  base_learner *l;
  single_learner *__src;
  learner<LRQstate,_example> *__dest;
  vw_exception *this_00;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lrq_names;
  size_type __dnew_2;
  option_group_definition new_options;
  size_type __dnew_1;
  size_type __dnew;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4c8;
  options_i *local_4b0;
  _Base_ptr local_4a8;
  _func_int ***local_4a0;
  _func_int **local_498;
  _func_int **local_490 [2];
  bool *local_480;
  long local_478;
  option_group_definition local_470;
  long *local_438;
  long local_430;
  long local_428 [2];
  _func_int ***local_418;
  _func_int **local_410;
  _func_int **local_408 [2];
  string local_3f8;
  string local_3d8;
  string local_3b8;
  undefined1 local_398 [112];
  bool local_328;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_310;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_300;
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [96];
  bool local_288;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_270;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_260;
  typed_option<bool> local_170;
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_d0;
  
  __s = calloc_or_throw<LRQstate>(1);
  p_Var1 = &(__s->lrpairs)._M_t._M_impl.super__Rb_tree_header;
  memset(__s,0,0x950);
  (__s->lrpairs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (__s->lrpairs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  local_4c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_4c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_4c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2f8._0_8_ = (_func_int **)0x13;
  local_4a8 = &p_Var1->_M_header;
  local_4a0 = local_490;
  local_4a0 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_4a0,(ulong)local_2f8);
  local_490[0] = (_func_int **)local_2f8._0_8_;
  *(undefined4 *)local_4a0 = 0x20776f4c;
  builtin_strncpy((char *)((long)local_4a0 + 4),"Rank",4);
  *(undefined4 *)(local_4a0 + 1) = 0x61755120;
  builtin_strncpy((char *)((long)local_4a0 + 0xc),"drat",4);
  builtin_strncpy((char *)((long)local_4a0 + 0xf),"tics",4);
  local_498 = (_func_int **)local_2f8._0_8_;
  *(char *)((long)local_4a0 + local_2f8._0_8_) = '\0';
  local_470.m_name._M_dataplus._M_p = (pointer)&local_470.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_470,local_4a0,(pointer)(local_2f8._0_8_ + (long)local_4a0));
  local_470.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_470.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_470.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_4a0 != local_490) {
    operator_delete(local_4a0);
  }
  local_3d8.field_2._M_allocated_capacity._0_4_ = 0x71726c;
  local_3d8._M_string_length = 3;
  local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_2f8,&local_3d8,&local_4c8);
  local_288 = true;
  local_398._0_8_ = (_func_int **)0x1f;
  local_418 = local_408;
  local_418 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_418,(ulong)local_398);
  local_408[0] = (_func_int **)local_398._0_8_;
  builtin_strncpy((char *)((long)local_418 + 0xf),"adratic ",8);
  builtin_strncpy((char *)((long)local_418 + 0x17),"features",8);
  *local_418 = (_func_int **)0x20776f6c20657375;
  local_418[1] = (_func_int **)0x617571206b6e6172;
  local_410 = (_func_int **)local_398._0_8_;
  *(char *)((long)local_418 + local_398._0_8_) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_2e8 + 0x20));
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::typed_option(&local_d0,
                 (typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_2f8);
  local_4b0 = options;
  this = VW::config::option_group_definition::
         add<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                   (&local_470,&local_d0);
  local_3f8.field_2._M_allocated_capacity = 0x6f706f726471726c;
  local_3f8.field_2._8_2_ = 0x7475;
  local_3f8._M_string_length = 10;
  local_3f8.field_2._M_local_buf[10] = '\0';
  local_480 = &__s->dropout;
  local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
  VW::config::typed_option<bool>::typed_option((typed_option<bool> *)local_398,&local_3f8,local_480)
  ;
  local_328 = true;
  local_478 = 0x34;
  local_438 = local_428;
  local_438 = (long *)std::__cxx11::string::_M_create((ulong *)&local_438,(ulong)&local_478);
  local_428[0] = local_478;
  local_438[4] = 0x617264617571206b;
  local_438[5] = 0x7461656620636974;
  local_438[2] = 0x726f6620676e696e;
  local_438[3] = 0x6e617220776f6c20;
  *local_438 = 0x706f726420657375;
  local_438[1] = 0x696172742074756f;
  *(undefined4 *)(local_438 + 6) = 0x73657275;
  local_430 = local_478;
  *(char *)((long)local_438 + local_478) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_398 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_170,(typed_option<bool> *)local_398);
  VW::config::option_group_definition::add<bool>(this,&local_170);
  local_170.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d1618;
  if (local_170.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_170.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_170.super_base_option);
  if (local_438 != local_428) {
    operator_delete(local_438);
  }
  local_398._0_8_ = &PTR__typed_option_002d1618;
  if (local_300._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_300._M_pi);
  }
  if (local_310._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_310._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_398);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
    operator_delete(local_3f8._M_dataplus._M_p);
  }
  poVar5 = local_4b0;
  local_d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d16f0;
  if (local_d0.m_default_value.
      super___shared_ptr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_default_value.
               super___shared_ptr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_d0.m_value.
      super___shared_ptr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_value.
               super___shared_ptr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_d0.super_base_option);
  if (local_418 != local_408) {
    operator_delete(local_418);
  }
  local_2f8._0_8_ = &PTR__typed_option_002d16f0;
  if (local_260._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_260._M_pi);
  }
  if (local_270._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_270._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_2f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
    operator_delete(local_3d8._M_dataplus._M_p);
  }
  (**poVar5->_vptr_options_i)(poVar5,&local_470);
  local_2e8._0_4_ = 0x71726c;
  local_2f8._8_8_ = (pointer)0x3;
  local_2f8._0_8_ = local_2e8;
  iVar6 = (*poVar5->_vptr_options_i[1])(poVar5,local_2f8);
  if ((undefined1 *)local_2f8._0_8_ != local_2e8) {
    operator_delete((void *)local_2f8._0_8_);
  }
  if ((char)iVar6 == '\0') {
    __dest = (learner<LRQstate,_example> *)0x0;
  }
  else {
    __s->all = all;
    if (local_4c8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_4c8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      lVar12 = 0;
      uVar11 = 0;
      do {
        spoof_hex_encoded_namespaces
                  ((string *)local_2f8,
                   (string *)
                   ((long)&((local_4c8.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar12)
                  );
        std::__cxx11::string::operator=
                  ((string *)
                   ((long)&((local_4c8.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar12)
                   ,(string *)local_2f8);
        if ((undefined1 *)local_2f8._0_8_ != local_2e8) {
          operator_delete((void *)local_2f8._0_8_);
        }
        uVar11 = uVar11 + 1;
        lVar12 = lVar12 + 0x20;
      } while (uVar11 < (ulong)((long)local_4c8.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_4c8.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 5));
    }
    std::
    set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::
    set<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&__s->lrpairs,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )local_4c8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )local_4c8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
    uVar11 = all->random_seed | 0x845fed;
    __s->seed = uVar11;
    __s->initial_seed = uVar11;
    if (all->quiet == false) {
      std::__ostream_insert<char,std::char_traits<char>>
                (&(all->trace_message).super_ostream,
                 "creating low rank quadratic features for pairs: ",0x30);
      if (*local_480 == true) {
        std::__ostream_insert<char,std::char_traits<char>>
                  (&(all->trace_message).super_ostream,"(using dropout) ",0x10);
      }
    }
    p_Var9 = (__s->lrpairs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if (p_Var9 == local_4a8) {
      uVar10 = 1;
    }
    else {
      uVar10 = 0;
      do {
        if (all->quiet == false) {
          if (p_Var9[1]._M_parent < (_Base_ptr)0x3) {
LAB_00241576:
            std::__cxx11::stringstream::stringstream((stringstream *)local_2f8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2e8,
                       "error, low-rank quadratic features must involve two sets and a rank.",0x44);
            this_00 = (vw_exception *)__cxa_allocate_exception(0x38);
            std::__cxx11::stringbuf::str();
            VW::vw_exception::vw_exception
                      (this_00,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/lrq.cc"
                       ,0xc3,&local_3b8);
            __cxa_throw(this_00,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
          }
          lVar12 = *(long *)(p_Var9 + 1);
          strtoul((char *)(lVar12 + 2),(char **)local_2f8,0);
          if ((*(char *)(lVar12 + 2) == '\0') || (*(char *)local_2f8._0_8_ != '\0'))
          goto LAB_00241576;
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (&(all->trace_message).super_ostream,*(char **)(p_Var9 + 1),
                              (long)p_Var9[1]._M_parent);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
        }
        pcVar3 = *(char **)(p_Var9 + 1);
        uVar7 = atoi(pcVar3 + 2);
        __s->lrindices[*pcVar3] = true;
        __s->lrindices[*(char *)(*(long *)(p_Var9 + 1) + 1)] = true;
        if (uVar10 <= uVar7) {
          uVar10 = uVar7;
        }
        p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
      } while (p_Var9 != local_4a8);
      uVar10 = uVar10 + 1;
    }
    if (all->quiet == false) {
      cVar4 = (char)all + -0x20;
      std::ios::widen((char)(all->trace_message).super_ostream._vptr_basic_ostream[-3] + cVar4);
      std::ostream::put(cVar4);
      std::ostream::flush();
    }
    all->wpp = all->wpp * uVar10;
    l = setup_base(local_4b0,all);
    __src = LEARNER::as_singleline<char,char>(l);
    uVar2 = *(undefined4 *)(__src + 0xd0);
    __dest = calloc_or_throw<LEARNER::learner<LRQstate,example>>(1);
    memcpy(__dest,__src,0xe9);
    *(single_learner **)(__dest + 0x20) = __src;
    *(code **)(__dest + 0x50) = LEARNER::recur_sensitivity;
    *(LRQstate **)(__dest + 0xb8) = __s;
    *(single_learner **)(__dest + 0xc0) = __src;
    *(code **)(__dest + 200) = LEARNER::noop;
    *(ulong *)(__dest + 0xd8) = (ulong)uVar10;
    *(ulong *)(__dest + 0xe0) = (ulong)uVar10 * *(long *)(__src + 0xe0);
    *(LRQstate **)(__dest + 0x18) = __s;
    *(code **)(__dest + 0x28) = predict_or_learn<true>;
    *(code **)(__dest + 0x38) = predict_or_learn<true>;
    *(code **)(__dest + 0x30) = predict_or_learn<false>;
    *(undefined8 *)(__dest + 0x40) = 0;
    *(undefined4 *)(__dest + 0xd0) = uVar2;
    __dest[0xe8] = (learner<LRQstate,_example>)0x0;
    *(LRQstate **)(__dest + 0x88) = __s;
    *(single_learner **)(__dest + 0x90) = __src;
    *(code **)(__dest + 0x98) = reset_seed;
    *(LRQstate **)(__dest + 0xb8) = __s;
    *(single_learner **)(__dest + 0xc0) = __src;
    *(code **)(__dest + 200) = finish;
    __s = (LRQstate *)0x0;
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_470.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470.m_name._M_dataplus._M_p != &local_470.m_name.field_2) {
    operator_delete(local_470.m_name._M_dataplus._M_p);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_4c8);
  if (__s != (LRQstate *)0x0) {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&(__s->lrpairs)._M_t);
    free(__s);
  }
  return (base_learner *)__dest;
}

Assistant:

base_learner* lrq_setup(options_i& options, vw& all)
{
  auto lrq = scoped_calloc_or_throw<LRQstate>();
  vector<string> lrq_names;
  option_group_definition new_options("Low Rank Quadratics");
  new_options.add(make_option("lrq", lrq_names).keep().help("use low rank quadratic features"))
      .add(make_option("lrqdropout", lrq->dropout).keep().help("use dropout training for low rank quadratic features"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("lrq"))
    return nullptr;

  uint32_t maxk = 0;
  lrq->all = &all;

  for (size_t i = 0; i < lrq_names.size(); i++) lrq_names[i] = spoof_hex_encoded_namespaces(lrq_names[i]);

  new (&lrq->lrpairs) std::set<std::string>(lrq_names.begin(), lrq_names.end());

  lrq->initial_seed = lrq->seed = all.random_seed | 8675309;

  if (!all.quiet)
  {
    all.trace_message << "creating low rank quadratic features for pairs: ";
    if (lrq->dropout)
      all.trace_message << "(using dropout) ";
  }

  for (string const& i : lrq->lrpairs)
  {
    if (!all.quiet)
    {
      if ((i.length() < 3) || !valid_int(i.c_str() + 2))
        THROW("error, low-rank quadratic features must involve two sets and a rank.");

      all.trace_message << i << " ";
    }
    // TODO: colon-syntax

    unsigned int k = atoi(i.c_str() + 2);

    lrq->lrindices[(int)i[0]] = 1;
    lrq->lrindices[(int)i[1]] = 1;

    maxk = max(maxk, k);
  }

  if (!all.quiet)
    all.trace_message << endl;

  all.wpp = all.wpp * (uint64_t)(1 + maxk);
  learner<LRQstate, example>& l = init_learner(
      lrq, as_singleline(setup_base(options, all)), predict_or_learn<true>, predict_or_learn<false>, 1 + maxk);
  l.set_end_pass(reset_seed);
  l.set_finish(finish);

  // TODO: leaks memory ?
  return make_base(l);
}